

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::JunitReporter(JunitReporter *this,ReporterConfig *_config)

{
  ostream *os;
  ReporterConfig *_config_local;
  JunitReporter *this_local;
  
  CumulativeReporterBase::CumulativeReporterBase(&this->super_CumulativeReporterBase,_config);
  (this->super_CumulativeReporterBase).super_SharedImpl<Catch::IStreamingReporter>.
  super_IStreamingReporter.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__JunitReporter_0027b740;
  os = ReporterConfig::stream(_config);
  XmlWriter::XmlWriter(&this->xml,os);
  Timer::Timer(&this->suiteTimer);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->stdOutForSuite);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->stdErrForSuite);
  (this->super_CumulativeReporterBase).m_reporterPrefs.shouldRedirectStdOut = true;
  return;
}

Assistant:

JunitReporter( ReporterConfig const& _config )
        :   CumulativeReporterBase( _config ),
            xml( _config.stream() )
        {
            m_reporterPrefs.shouldRedirectStdOut = true;
        }